

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

PolicyStatus __thiscall cmState::Snapshot::GetPolicy(Snapshot *this,PolicyID id)

{
  iterator other;
  bool bVar1;
  PolicyStatus PVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pPVar5;
  iterator other_00;
  iterator dir;
  iterator leaf;
  PositionType p;
  PositionType e;
  iterator local_88;
  Snapshot *local_70;
  iterator local_68;
  iterator local_58;
  iterator local_48;
  
  PVar2 = cmPolicies::GetPolicyStatus(id);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    return PVar2;
  }
  local_70 = this;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  local_88.Tree = (pSVar3->BuildSystemDirectory).Tree;
  local_88.Position = (pSVar3->BuildSystemDirectory).Position;
  if (local_88.Tree != (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)0x0) {
    do {
      if ((ulong)(((long)((local_88.Tree)->Data).
                         super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((local_88.Tree)->Data).
                         super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6fb586fb586fb587) <
          local_88.Position) break;
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(&local_88)
      ;
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pBVar4->DirectoryEnd);
      local_68.Tree = (pSVar3->Policies).Tree;
      local_68.Position = (pSVar3->Policies).Position;
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(&local_88)
      ;
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pBVar4->DirectoryEnd);
      other = pSVar3->PolicyRoot;
      while (bVar1 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator!=(&local_68,other),
            bVar1) {
        pPVar5 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->(&local_68);
        bVar1 = cmPolicies::PolicyMap::IsDefined(&pPVar5->super_PolicyMap,id);
        if (bVar1) {
          pPVar5 = cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator->(&local_68);
          PVar2 = cmPolicies::PolicyMap::Get(&pPVar5->super_PolicyMap,id);
          return PVar2;
        }
        cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++(&local_68);
      }
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->(&local_88)
      ;
      local_48.Tree = (pBVar4->DirectoryEnd).Tree;
      local_48.Position = (pBVar4->DirectoryEnd).Position;
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_48);
      local_58.Tree = (pSVar3->DirectoryParent).Tree;
      local_58.Position = (pSVar3->DirectoryParent).Position;
      other_00.Tree = &local_70->State->SnapshotData;
      other_00.Position = 0;
      bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==(&local_58,other_00);
      if (bVar1) {
        return PVar2;
      }
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_58);
      local_88.Tree = (pSVar3->BuildSystemDirectory).Tree;
      local_88.Position = (pSVar3->BuildSystemDirectory).Position;
    } while (local_88.Tree != (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)0x0);
  }
  __assert_fail("dir.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x4f5,
                "cmPolicies::PolicyStatus cmState::Snapshot::GetPolicy(cmPolicies::PolicyID) const")
  ;
}

Assistant:

cmPolicies::PolicyStatus
cmState::Snapshot::GetPolicy(cmPolicies::PolicyID id) const
{
  cmPolicies::PolicyStatus status = cmPolicies::GetPolicyStatus(id);

  if(status == cmPolicies::REQUIRED_ALWAYS ||
     status == cmPolicies::REQUIRED_IF_USED)
    {
    return status;
    }

  cmLinkedTree<BuildsystemDirectoryStateType>::iterator dir =
      this->Position->BuildSystemDirectory;

  while (true)
    {
    assert(dir.IsValid());
    cmLinkedTree<PolicyStackEntry>::iterator leaf =
        dir->DirectoryEnd->Policies;
    cmLinkedTree<PolicyStackEntry>::iterator root =
        dir->DirectoryEnd->PolicyRoot;
    for( ; leaf != root; ++leaf)
      {
      if(leaf->IsDefined(id))
        {
        status = leaf->Get(id);
        return status;
        }
      }
    cmState::PositionType e = dir->DirectoryEnd;
    cmState::PositionType p = e->DirectoryParent;
    if (p == this->State->SnapshotData.Root())
      {
      break;
      }
    dir = p->BuildSystemDirectory;
    }
  return status;
}